

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<StatementAstNode>_> * __thiscall
Parser::parseStatement
          (optional<std::shared_ptr<StatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  undefined1 local_38 [24];
  
  skipWhiteSpace(this);
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged = false;
  TokenBuffer::currentToken((TokenBuffer *)local_38);
  iVar1 = *(int *)&(((element_type *)(local_38._0_8_ + 0x20))->super_StatementAstNode).super_AstNode
                   ._vptr_AstNode;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  switch(iVar1) {
  case 10:
    parseReturnStatement((optional<std::shared_ptr<ReturnStatementAstNode>_> *)local_38,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<ReturnStatementAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_> *)local_38);
    break;
  case 0xb:
    parseBreakStatement((optional<std::shared_ptr<BreakStatementAstNode>_> *)local_38,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<BreakStatementAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_> *)local_38);
    break;
  case 0xd:
    parseIfStatement((optional<std::shared_ptr<IfStatementAstNode>_> *)local_38,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<IfStatementAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<IfStatementAstNode>_> *)local_38);
    break;
  case 0xf:
    parseWhileStatement((optional<std::shared_ptr<WhileStatementAstNode>_> *)local_38,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<WhileStatementAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_> *)local_38);
    break;
  case 0x11:
    parseDeclareStatement((optional<std::shared_ptr<DeclareStatementAstNode>_> *)local_38,this);
    std::optional<std::shared_ptr<StatementAstNode>>::operator=
              ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<DeclareStatementAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_> *)local_38);
    break;
  default:
    if (iVar1 == 2) {
      parseBlockStatement((optional<std::shared_ptr<BlockStatementAstNode>_> *)local_38,this);
      std::optional<std::shared_ptr<StatementAstNode>>::operator=
                ((optional<std::shared_ptr<StatementAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<BlockStatementAstNode>_> *)local_38);
      std::_Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_> *)local_38);
      break;
    }
  case 0xc:
  case 0xe:
  case 0x10:
    parseAssignOrExpressionStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_38,this);
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)__return_storage_ptr__,
               (_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)local_38);
  }
  skipWhiteSpace(this);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<StatementAstNode>>
Parser::parseStatement() noexcept {
  this->skipWhiteSpace();

  std::optional<std::shared_ptr<StatementAstNode>> s;

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::Var:
      s = this->parseDeclareStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::If:
      s = this->parseIfStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::While:
      s = this->parseWhileStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::Break:
      s = this->parseBreakStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::Return:
      s = this->parseReturnStatement();
      this->skipWhiteSpace();
      return s;
    case TokenType::LeftCurly:
      s = this->parseBlockStatement();
      this->skipWhiteSpace();
      return s;
    default:
      s = this->parseAssignOrExpressionStatement();
      this->skipWhiteSpace();
      return s;
  }
}